

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::deinit(UBOBindingRenderCase *this)

{
  int iVar1;
  pointer puVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  
  LayoutBindingRenderCase::deinit(&this->super_LayoutBindingRenderCase);
  puVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_buffers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (*(int *)((long)puVar2 + lVar3) != 0) {
        iVar1 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))
                  (1,(long)(this->m_buffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar3);
        iVar1 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x40))(0x8a11,0);
      }
      lVar4 = lVar4 + 1;
      puVar2 = (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 4;
    } while (lVar4 < (int)((ulong)((long)(this->m_buffers).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)
                          >> 2));
  }
  return;
}

Assistant:

void UBOBindingRenderCase::deinit (void)
{
	LayoutBindingRenderCase::deinit();

	// Clean up UBO data
	for (int bufNdx = 0; bufNdx < (int)m_buffers.size(); ++bufNdx)
	{
		if (m_buffers[bufNdx])
		{
			m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_buffers[bufNdx]);
			m_context.getRenderContext().getFunctions().bindBuffer(GL_UNIFORM_BUFFER, 0);
		}
	}
}